

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O0

bool __thiscall TxOrphanage::AddTx(TxOrphanage *this,CTransactionRef *tx,NodeId peer)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  Txid *pTVar3;
  Wtxid *pWVar4;
  size_type sVar5;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar6;
  size_t in_RDX;
  char *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>,_bool>
  pVar8;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  Wtxid *wtxid;
  Txid *hash;
  const_iterator __end1;
  const_iterator __begin1;
  uint sz;
  pair<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_bool>
  ret;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffdcc;
  transaction_identifier<true> *in_stack_fffffffffffffdd0;
  OrphanTx *in_stack_fffffffffffffdd8;
  transaction_identifier<true> *in_stack_fffffffffffffde0;
  key_type *in_stack_fffffffffffffde8;
  map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  *in_stack_fffffffffffffdf0;
  LogFlags in_stack_fffffffffffffe30;
  undefined1 *flag;
  undefined8 in_stack_fffffffffffffe38;
  int iVar11;
  duration *pdVar10;
  ConstevalFormatString<5U> in_stack_fffffffffffffe78;
  char *fmt;
  bool local_151;
  undefined1 local_f8 [24];
  duration local_e0;
  size_type local_d8;
  uint local_ac;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _Base_ptr local_98;
  Level in_stack_ffffffffffffff70;
  Level level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa0;
  
  iVar11 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pTVar3 = CTransaction::GetHash
                     ((CTransaction *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
  ;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pWVar4 = CTransaction::GetWitnessHash
                     ((CTransaction *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
  ;
  sVar5 = std::
          map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::count((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                   *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  if (sVar5 == 0) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_fffffffffffffdd8);
    local_ac = GetTransactionWeight
                         ((CTransaction *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if (local_ac < 0x61a81) {
      flag = local_f8;
      std::shared_ptr<const_CTransaction>::shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (shared_ptr<const_CTransaction> *)0x1457a6c);
      pdVar10 = &local_e0;
      Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
      tVar6 = std::chrono::operator+
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffffdd0,
                         (duration<long,_std::ratio<60L,_1L>_> *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pdVar10->__r = (rep)tVar6.__d.__r;
      local_d8 = std::
                 vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 ::size((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pVar7 = std::
              map<transaction_identifier<true>,TxOrphanage::OrphanTx,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
              ::emplace<transaction_identifier<true>const&,TxOrphanage::OrphanTx>
                        ((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                          *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8);
      local_98 = (_Base_ptr)pVar7.first._M_node;
      level = CONCAT31((int3)(in_stack_ffffffffffffff70 >> 8),pVar7.second);
      OrphanTx::~OrphanTx((OrphanTx *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
      ;
      if ((level & Debug) == Trace) {
        __assert_fail("ret.second",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
                      ,0x25,"bool TxOrphanage::AddTx(const CTransactionRef &, NodeId)");
      }
      std::
      vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                   *)in_stack_fffffffffffffdd8,(value_type *)in_stack_fffffffffffffdd0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdd0);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdd0);
      while( true ) {
        bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                            *)in_stack_fffffffffffffdd8,
                           (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                            *)in_stack_fffffffffffffdd0);
        iVar11 = (int)((ulong)pdVar10 >> 0x20);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        std::
        map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
        ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        pVar8 = std::
                set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                ::insert((set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                          *)in_stack_fffffffffffffdd8,(value_type *)in_stack_fffffffffffffdd0);
        local_a8 = (_Base_ptr)pVar8.first._M_node;
        local_a0 = pVar8.second;
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      }
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                   (char *)in_stack_fffffffffffffde0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                   (char *)in_stack_fffffffffffffde0);
        transaction_identifier<false>::ToString_abi_cxx11_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffdd0);
        transaction_identifier<true>::ToString_abi_cxx11_(in_stack_fffffffffffffdd0);
        std::
        map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
        ::size((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        std::
        map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
        ::size((map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        uVar9 = 1;
        logging_function_00._M_str = in_RSI;
        logging_function_00._M_len = in_RDX;
        source_file_00._M_str = (char *)pTVar3;
        source_file_00._M_len = (size_t)pWVar4;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long>
                  (logging_function_00,source_file_00,iVar11,(LogFlags)flag,level,
                   in_stack_fffffffffffffe78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                   (uint *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffffa0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,uVar9));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,uVar9));
      }
      local_151 = true;
    }
    else {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                   (char *)in_stack_fffffffffffffde0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                   (char *)in_stack_fffffffffffffde0);
        fmt = "ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n";
        transaction_identifier<false>::ToString_abi_cxx11_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffdd0);
        transaction_identifier<true>::ToString_abi_cxx11_(in_stack_fffffffffffffdd0);
        uVar9 = 1;
        logging_function._M_str = in_RSI;
        logging_function._M_len = in_RDX;
        source_file._M_str = (char *)pTVar3;
        source_file._M_len = (size_t)pWVar4;
        LogPrintFormatInternal<unsigned_int,std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,iVar11,in_stack_fffffffffffffe30,
                   in_stack_ffffffffffffff70,(ConstevalFormatString<3U>)fmt,
                   (uint *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,uVar9));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,uVar9));
      }
      local_151 = false;
    }
  }
  else {
    local_151 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_151;
}

Assistant:

bool TxOrphanage::AddTx(const CTransactionRef& tx, NodeId peer)
{
    const Txid& hash = tx->GetHash();
    const Wtxid& wtxid = tx->GetWitnessHash();
    if (m_orphans.count(wtxid))
        return false;

    // Ignore big transactions, to avoid a
    // send-big-orphans memory exhaustion attack. If a peer has a legitimate
    // large transaction with a missing parent then we assume
    // it will rebroadcast it later, after the parent transaction(s)
    // have been mined or received.
    // 100 orphans, each of which is at most 100,000 bytes big is
    // at most 10 megabytes of orphans and somewhat more byprev index (in the worst case):
    unsigned int sz = GetTransactionWeight(*tx);
    if (sz > MAX_STANDARD_TX_WEIGHT)
    {
        LogDebug(BCLog::TXPACKAGES, "ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n", sz, hash.ToString(), wtxid.ToString());
        return false;
    }

    auto ret = m_orphans.emplace(wtxid, OrphanTx{tx, peer, Now<NodeSeconds>() + ORPHAN_TX_EXPIRE_TIME, m_orphan_list.size()});
    assert(ret.second);
    m_orphan_list.push_back(ret.first);
    for (const CTxIn& txin : tx->vin) {
        m_outpoint_to_orphan_it[txin.prevout].insert(ret.first);
    }

    LogDebug(BCLog::TXPACKAGES, "stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n", hash.ToString(), wtxid.ToString(), sz,
             m_orphans.size(), m_outpoint_to_orphan_it.size());
    return true;
}